

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.c
# Opt level: O1

wchar_t mb_to_wc(wchar_t codepage,wchar_t flags,char *mbstr,wchar_t mblen,wchar_t *wcstr,
                wchar_t wclen)

{
  uint uVar1;
  wchar_t wVar2;
  size_t sVar3;
  ulong uVar4;
  wchar_t mblen_local;
  char *mbstr_local;
  mbstate_t state;
  
  mblen_local = mblen;
  mbstr_local = mbstr;
  if (codepage == L'\xffff') {
    state.__count = L'\0';
    state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
    uVar4 = 0;
    while (((0 < (long)mblen_local && (wVar2 = (wchar_t)uVar4, wVar2 < wclen)) &&
           (sVar3 = mbrtowc(wcstr + wVar2,mbstr_local,(long)mblen_local,(mbstate_t *)&state),
           sVar3 < 0xfffffffffffffffe))) {
      mbstr_local = mbstr_local + sVar3;
      uVar4 = (ulong)(uint)(wVar2 + L'\x01');
      mblen_local = mblen_local - (int)sVar3;
    }
  }
  else if (codepage == L'\0') {
    uVar4 = 0;
    if (L'\0' < wclen && L'\0' < mblen) {
      uVar1 = wclen + L'\xffffffff';
      if ((uint)(mblen + L'\xffffffff') < (uint)(wclen + L'\xffffffff')) {
        uVar1 = mblen + L'\xffffffff';
      }
      uVar4 = 0;
      do {
        wcstr[uVar4] = (byte)mbstr[uVar4] | 0xd800;
        uVar4 = uVar4 + 1;
      } while (uVar1 + 1 != uVar4);
    }
  }
  else {
    wVar2 = charset_to_unicode(&mbstr_local,&mblen_local,wcstr,wclen,codepage,(charset_state *)0x0,
                               (wchar_t *)0x0,L'\0');
    uVar4 = (ulong)(uint)wVar2;
  }
  return (wchar_t)uVar4;
}

Assistant:

int mb_to_wc(int codepage, int flags, const char *mbstr, int mblen,
             wchar_t *wcstr, int wclen)
{
    if (codepage == DEFAULT_CODEPAGE) {
        int n = 0;
        mbstate_t state;

        memset(&state, 0, sizeof state);

        while (mblen > 0) {
            if (n >= wclen)
                return n;
            size_t i = mbrtowc(wcstr+n, mbstr, (size_t)mblen, &state);
            if (i == (size_t)-1 || i == (size_t)-2)
                break;
            n++;
            mbstr += i;
            mblen -= i;
        }

        return n;
    } else if (codepage == CS_NONE) {
        int n = 0;

        while (mblen > 0) {
            if (n >= wclen)
                return n;
            wcstr[n] = 0xD800 | (mbstr[0] & 0xFF);
            n++;
            mbstr++;
            mblen--;
        }

        return n;
    } else
        return charset_to_unicode(&mbstr, &mblen, wcstr, wclen, codepage,
                                  NULL, NULL, 0);
}